

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell::
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell
          (TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell_003e64e0;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, freeOnlyTheMemoryInTheAllocationStage)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    detector->increaseAllocationStage();
    detector->allocMemory(defaultMallocAllocator(), 2);
    detector->deallocAllMemoryInCurrentAllocationStage();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}